

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Sequence::Get_weight(ChFunction_Sequence *this,double x)

{
  _List_node_base *p_Var1;
  double dVar2;
  
  dVar2 = 1.0;
  p_Var1 = (_List_node_base *)&this->functions;
  while (p_Var1 = (((_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->functions) {
    if ((double)p_Var1[3]._M_next <= x) {
      if (x < (double)p_Var1[3]._M_prev) {
        dVar2 = *(double *)((long)(p_Var1 + 1 + 1) + 8);
      }
    }
  }
  return dVar2;
}

Assistant:

double ChFunction_Sequence::Get_weight(double x) const {
    double res = 1.0;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if ((x >= iter->t_start) && (x < iter->t_end)) {
            res = iter->weight;
        }
    }
    return res;
}